

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

fp __thiscall fmt::v6::internal::normalize<0>(internal *this,fp value)

{
  fp fVar1;
  int offset;
  uint64_t shifted_implicit_bit;
  fp value_local;
  
  value_local.e = (int)value.f;
  for (value_local.f = (significand_type)this; (value_local.f & 0x10000000000000) == 0;
      value_local.f = value_local.f << 1) {
    value_local.e = value_local.e + -1;
  }
  fVar1.f = value_local.f << 0xb;
  fVar1.e = value_local.e + -0xb;
  fVar1._12_4_ = 0;
  return fVar1;
}

Assistant:

fp normalize(fp value) {
  // Handle subnormals.
  const auto shifted_implicit_bit = fp::implicit_bit << SHIFT;
  while ((value.f & shifted_implicit_bit) == 0) {
    value.f <<= 1;
    --value.e;
  }
  // Subtract 1 to account for hidden bit.
  const auto offset =
      fp::significand_size - fp::double_significand_size - SHIFT - 1;
  value.f <<= offset;
  value.e -= offset;
  return value;
}